

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O0

int TIFFInitCCITTFax4(TIFF *tif,int scheme)

{
  int iVar1;
  int scheme_local;
  TIFF *tif_local;
  
  iVar1 = InitCCITTFax3(tif);
  if (iVar1 == 0) {
    tif_local._4_4_ = 0;
  }
  else {
    iVar1 = _TIFFMergeFields(tif,fax4Fields,1);
    if (iVar1 == 0) {
      TIFFErrorExtR(tif,"TIFFInitCCITTFax4","Merging CCITT Fax 4 codec-specific tags failed");
      tif_local._4_4_ = 0;
    }
    else {
      tif->tif_decoderow = Fax4Decode;
      tif->tif_decodestrip = Fax4Decode;
      tif->tif_decodetile = Fax4Decode;
      tif->tif_encoderow = Fax4Encode;
      tif->tif_encodestrip = Fax4Encode;
      tif->tif_encodetile = Fax4Encode;
      tif->tif_postencode = Fax4PostEncode;
      tif_local._4_4_ = TIFFSetField(tif,0x10000,1);
    }
  }
  return tif_local._4_4_;
}

Assistant:

int TIFFInitCCITTFax4(TIFF *tif, int scheme)
{
    (void)scheme;
    if (InitCCITTFax3(tif))
    { /* reuse G3 support */
        /*
         * Merge codec-specific tag information.
         */
        if (!_TIFFMergeFields(tif, fax4Fields, TIFFArrayCount(fax4Fields)))
        {
            TIFFErrorExtR(tif, "TIFFInitCCITTFax4",
                          "Merging CCITT Fax 4 codec-specific tags failed");
            return 0;
        }

        tif->tif_decoderow = Fax4Decode;
        tif->tif_decodestrip = Fax4Decode;
        tif->tif_decodetile = Fax4Decode;
        tif->tif_encoderow = Fax4Encode;
        tif->tif_encodestrip = Fax4Encode;
        tif->tif_encodetile = Fax4Encode;
        tif->tif_postencode = Fax4PostEncode;
        /*
         * Suppress RTC at the end of each strip.
         */
        return TIFFSetField(tif, TIFFTAG_FAXMODE, FAXMODE_NORTC);
    }
    else
        return (0);
}